

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphic.h
# Opt level: O0

void __thiscall
mpt::updates<const_mpt::convertable_*,_mpt::graphic::hint>::compress
          (updates<const_mpt::convertable_*,_mpt::graphic::hint> *this,int mask)

{
  undefined8 uVar1;
  element *peVar2;
  void *pvVar3;
  long lVar4;
  ulong uVar5;
  element *peVar6;
  content *pcVar7;
  undefined8 *puVar8;
  content *d;
  long j;
  long max;
  long i;
  long len;
  element *c;
  element *u;
  int mask_local;
  updates<const_mpt::convertable_*,_mpt::graphic::hint> *this_local;
  
  c = (element *)0x0;
  pvVar3 = array::base(&this->super_array);
  max = 0;
  lVar4 = length(this);
  do {
    if (lVar4 <= max) {
      pcVar7 = reference<mpt::array::content>::instance((reference<mpt::array::content> *)this);
      if (pcVar7 != (content *)0x0) {
        mpt::array::content::set_length((ulong)pcVar7);
      }
      return;
    }
    d = (content *)max;
    peVar6 = c;
    if (*(int *)((long)pvVar3 + max * 0x10 + 0xc) == 0) {
      if (c == (element *)0x0) {
        peVar6 = (element *)((long)pvVar3 + max * 0x10);
      }
    }
    else {
      while (d = d + 1, (long)d < lVar4) {
        if (((*(int *)((long)pvVar3 + (long)d * 0x10 + 0xc) != 0) &&
            (*(long *)((long)pvVar3 + max * 0x10) == *(long *)((long)pvVar3 + (long)d * 0x10))) &&
           (uVar5 = mpt::graphic::hint::merge
                              ((hint *)((long)pvVar3 + max * 0x10 + 8),
                               (int)pvVar3 + (int)d * 0x10 + 8), (uVar5 & 1) != 0)) {
          *(int *)((long)pvVar3 + max * 0x10 + 0xc) =
               *(int *)((long)pvVar3 + (long)d * 0x10 + 0xc) +
               *(int *)((long)pvVar3 + max * 0x10 + 0xc);
          element::invalidate((element *)((long)pvVar3 + (long)d * 0x10));
        }
      }
      if (c != (element *)0x0) {
        puVar8 = (undefined8 *)((long)pvVar3 + max * 0x10);
        c->data = (convertable *)*puVar8;
        uVar1 = puVar8[1];
        c->hint = (hint)(char)uVar1;
        *(int3 *)&c->field_0x9 = (int3)((ulong)uVar1 >> 8);
        c->used = (int)((ulong)uVar1 >> 0x20);
        element::invalidate((element *)((long)pvVar3 + max * 0x10));
        do {
          peVar6 = c + 1;
          if ((element *)((long)pvVar3 + max * 0x10) <= peVar6) break;
          peVar2 = c + 1;
          c = peVar6;
        } while (peVar2->used != 0);
      }
    }
    c = peVar6;
    max = max + 1;
  } while( true );
}

Assistant:

void compress(int mask = 0) {
		element *u = 0, *c = static_cast<element *>(base());
		long len = 0;
		
		for (long i = 0, max = length(); i < max; ++i) {
			if (!c[i].used) {
				if (!u) u = c + i;
				continue;
			}
			for (long j = i + 1; j < max; ++j) {
				if (!c[j].used || c[i].data != c[j].data) {
					continue;
				}
				if (!c[i].hint.merge(c[j].hint, mask)) {
					continue;
				}
				c[i].used += c[j].used;
				c[j].invalidate();
			}
			++len;
			
			if (!u) {
				continue;
			}
			*u = c[i];
			c[i].invalidate();
			
			while (++u < c + i) {
				if (!u->used) {
					break;
				}
			}
		}
		content *d;
		if ((d = _buf.instance())) {
			d->set_length(len * sizeof(*c));
		}
	}